

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

vector<int,_std::allocator<int>_> *
gmlc::utilities::str2vector<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string_view line,int defValue,
          string_view delimiters)

{
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> *str;
  pointer pbVar2;
  string_view sVar3;
  string_view V;
  int local_44;
  string_viewVector tempVec;
  
  sVar1 = delimiters._M_len;
  sVar3._M_str = line._M_str;
  sVar3._M_len = (size_t)sVar3._M_str;
  sVar3 = string_viewOps::removeBrackets((string_viewOps *)line._M_len,sVar3);
  string_viewOps::split(&tempVec,sVar3,(string_view)delimiters,off);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CLI::std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,
             (long)tempVec.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)tempVec.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  for (pbVar2 = tempVec.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != tempVec.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    V._M_str._0_4_ = defValue;
    V._M_len = (size_t)pbVar2->_M_str;
    V._M_str._4_4_ = 0;
    local_44 = numeric_conversion<int>((utilities *)pbVar2->_M_len,V,(int)sVar1);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,&local_44);
  }
  CLI::std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&tempVec.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::vector<X> str2vector(
    std::string_view line,
    const X defValue,
    std::string_view delimiters = string_viewOps::default_delim_chars)
{
    line = utilities::string_viewOps::removeBrackets(line);
    auto tempVec = utilities::string_viewOps::split(line, delimiters);
    std::vector<X> av;
    av.reserve(tempVec.size());
    for (const auto& str : tempVec) {
        av.push_back(numeric_conversion<X>(str, defValue));
    }
    return av;
}